

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-spoil.c
# Opt level: O0

_Bool copy_file(char *src,char *dest,file_type ft)

{
  _Bool _Var1;
  int iVar2;
  ang_file *f;
  int nin;
  _Bool result;
  char buf [1024];
  ang_file *fout;
  ang_file *fin;
  file_type ft_local;
  char *dest_local;
  char *src_local;
  
  f = file_open(src,MODE_READ,0xffffffff);
  if (f == (ang_file *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    buf._1016_8_ = file_open(dest,MODE_WRITE,ft);
    if ((ang_file *)buf._1016_8_ == (ang_file *)0x0) {
      file_close(f);
      src_local._7_1_ = false;
    }
    else {
      do {
        iVar2 = file_read(f,(char *)&nin,0x400);
        if (iVar2 < 1) {
          src_local._7_1_ = -1 < iVar2;
          goto LAB_0012e07d;
        }
        _Var1 = file_write((ang_file *)buf._1016_8_,(char *)&nin,(long)iVar2);
      } while (_Var1);
      src_local._7_1_ = false;
LAB_0012e07d:
      _Var1 = file_close((ang_file *)buf._1016_8_);
      if (!_Var1) {
        src_local._7_1_ = false;
      }
      _Var1 = file_close(f);
      if (!_Var1) {
        src_local._7_1_ = false;
      }
    }
  }
  return src_local._7_1_;
}

Assistant:

static bool copy_file(const char *src, const char *dest, file_type ft)
{
	ang_file *fin = file_open(src, MODE_READ, -1);
	ang_file *fout;
	char buf[1024];
	bool result;

	if (!fin) {
		return false;
	}

	fout = file_open(dest, MODE_WRITE, ft);
	if (!fout) {
		(void) file_close(fin);
		return false;
	}

	result = true;
	while (1) {
		int nin = file_read(fin, buf, sizeof(buf));

		if (nin > 0) {
			if (!file_write(fout, buf, nin)) {
				result = false;
				break;
			}
		} else {
			if (nin < 0) {
				result = false;
			}
			break;
		}
	}

	if (!file_close(fout)) {
		result = false;
	}
	if (!file_close(fin)) {
		result = false;
	}

	return result;
}